

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cauchy_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::cauchy_dist<long_double>::operator()
          (result_type_conflict3 *__return_storage_ptr__,cauchy_dist<long_double> *this,
          lcg64_shift *r)

{
  result_type_conflict3 *prVar1;
  
  utility::u01xx_traits<long_double,_1UL,_trng::lcg64_shift>::oo
            ((longdouble *)this,(lcg64_shift *)this);
  cosl();
  prVar1 = (result_type_conflict3 *)sinl();
  return prVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf_(utility::uniformoo<result_type>(r));
    }